

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

TiXmlHandle __thiscall TiXmlHandle::ChildElement(TiXmlHandle *this,int count)

{
  int iVar1;
  long lVar2;
  TiXmlNode *pTVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int in_EDX;
  undefined4 in_register_00000034;
  int iVar4;
  long *plVar5;
  bool bVar6;
  
  if (*(long *)CONCAT44(in_register_00000034,count) != 0) {
    pTVar3 = (TiXmlNode *)0x0;
    for (plVar5 = *(long **)(*(long *)CONCAT44(in_register_00000034,count) + 0x28);
        plVar5 != (long *)0x0; plVar5 = (long *)plVar5[9]) {
      lVar2 = (**(code **)(*plVar5 + 0x28))(plVar5);
      if (lVar2 != 0) {
        pTVar3 = (TiXmlNode *)(**(code **)(*plVar5 + 0x28))(plVar5);
        break;
      }
    }
    bVar6 = pTVar3 != (TiXmlNode *)0x0;
    if (0 < in_EDX && bVar6) {
      iVar4 = 0;
LAB_00181c67:
      do {
        pTVar3 = pTVar3->next;
        if (pTVar3 == (TiXmlNode *)0x0) {
          pTVar3 = (TiXmlNode *)0x0;
        }
        else {
          iVar1 = (*(pTVar3->super_TiXmlBase)._vptr_TiXmlBase[5])(pTVar3);
          if (CONCAT44(extraout_var,iVar1) == 0) goto LAB_00181c67;
          iVar1 = (*(pTVar3->super_TiXmlBase)._vptr_TiXmlBase[5])(pTVar3);
          pTVar3 = (TiXmlNode *)CONCAT44(extraout_var_00,iVar1);
        }
        bVar6 = pTVar3 != (TiXmlNode *)0x0;
        if (pTVar3 == (TiXmlNode *)0x0) break;
        iVar4 = iVar4 + 1;
      } while (iVar4 < in_EDX);
    }
    if (bVar6) goto LAB_00181ca6;
  }
  pTVar3 = (TiXmlNode *)0x0;
LAB_00181ca6:
  this->node = pTVar3;
  return (TiXmlHandle)(TiXmlNode *)this;
}

Assistant:

TiXmlHandle TiXmlHandle::ChildElement( int count ) const
{
	if ( node )
	{
		int i;
		TiXmlElement* child = node->FirstChildElement();
		for (	i=0;
				child && i<count;
				child = child->NextSiblingElement(), ++i )
		{
			// nothing
		}
		if ( child )
			return TiXmlHandle( child );
	}
	return TiXmlHandle( 0 );
}